

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O0

string * __thiscall
license::CryptoHelperLinux::exportPrivateKey_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this)

{
  char *pcVar1;
  logic_error *this_00;
  BIO_METHOD *type;
  long lVar2;
  allocator local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_69;
  char *local_68;
  char *pem_key;
  BIO *pBStack_58;
  int keylen;
  BIO *bio_private;
  allocator local_39;
  string local_38 [32];
  CryptoHelperLinux *local_18;
  CryptoHelperLinux *this_local;
  string *dest;
  
  local_18 = this;
  this_local = (CryptoHelperLinux *)__return_storage_ptr__;
  if (this->rsa != (RSA *)0x0) {
    type = BIO_s_mem();
    pBStack_58 = BIO_new(type);
    PEM_write_bio_RSAPrivateKey
              (pBStack_58,(RSA *)this->rsa,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,
               (void *)0x0);
    lVar2 = BIO_ctrl(pBStack_58,10,0,(void *)0x0);
    pem_key._4_4_ = (int)lVar2;
    local_68 = (char *)calloc((long)(pem_key._4_4_ + 1),1);
    BIO_read(pBStack_58,local_68,pem_key._4_4_);
    local_69 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"\"",&local_b1);
    pcVar1 = local_68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,pcVar1,&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"\n",&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"\\n\" \\\n\"",&local_149);
    replaceAll(&local_d8,&local_f8,&local_120,&local_148);
    std::operator+(&local_90,&local_b0,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"\"",&local_171);
    std::operator+(__return_storage_ptr__,&local_90,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    BIO_free_all(pBStack_58);
    free(local_68);
    return __return_storage_ptr__;
  }
  bio_private._3_1_ = 1;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Export not initialized.Call generateKeyPair first.",&local_39);
  std::logic_error::logic_error(this_00,local_38);
  bio_private._3_1_ = 0;
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const string CryptoHelperLinux::exportPrivateKey() const {
	if (rsa == NULL) {
		throw logic_error(
				string("Export not initialized.Call generateKeyPair first."));
	}
	BIO* bio_private = BIO_new(BIO_s_mem());
	PEM_write_bio_RSAPrivateKey(bio_private, rsa, NULL, NULL, 0, NULL, NULL);
	int keylen = BIO_pending(bio_private);
	char* pem_key = (char*) (calloc(keylen + 1, 1)); /* Null-terminate */
	BIO_read(bio_private, pem_key, keylen);
	string dest = string("\"")
			+ replaceAll(string(pem_key), string("\n"), string("\\n\" \\\n\""))
			+ string("\"");
	BIO_free_all(bio_private);
	free(pem_key);
	return dest;
}